

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O0

int testEncoding(int param_1,char **param_2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  int ret;
  char *loc;
  char **param_1_local;
  int param_0_local;
  
  pcVar6 = setlocale(6,"");
  if (pcVar6 == (char *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Locale: None");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Locale: ");
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  uVar1 = testHelloWorldEncoding();
  uVar2 = testRobustEncoding();
  uVar3 = testCommandLineArguments();
  uVar4 = testWithNulls();
  uVar5 = testToWindowsExtendedPath();
  return uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int testEncoding(int, char* [])
{
  const char* loc = setlocale(LC_ALL, "");
  if (loc) {
    std::cout << "Locale: " << loc << std::endl;
  } else {
    std::cout << "Locale: None" << std::endl;
  }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();
  ret |= testWithNulls();
  ret |= testToWindowsExtendedPath();

  return ret;
}